

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

uint32 __thiscall
Js::JavascriptCopyOnAccessNativeIntArray::GetNextIndex
          (JavascriptCopyOnAccessNativeIntArray *this,uint32 index)

{
  uint32 index_local;
  JavascriptCopyOnAccessNativeIntArray *this_local;
  
  if (((this->super_JavascriptNativeIntArray).super_JavascriptNativeArray.super_JavascriptArray.
       super_ArrayObject.length == 0) ||
     ((index != 0xffffffff &&
      ((this->super_JavascriptNativeIntArray).super_JavascriptNativeArray.super_JavascriptArray.
       super_ArrayObject.length <= index)))) {
    this_local._4_4_ = 0xffffffff;
  }
  else if (index == 0xffffffff) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = index + 1;
  }
  return this_local._4_4_;
}

Assistant:

uint32 JavascriptCopyOnAccessNativeIntArray::GetNextIndex(uint32 index) const
    {
        if (this->length == 0 || (index != Js::JavascriptArray::InvalidIndex && index >= this->length))
        {
            return Js::JavascriptArray::InvalidIndex;
        }
        else if (index == Js::JavascriptArray::InvalidIndex)
        {
            return 0;
        }
        else
        {
            return index + 1;
        }
    }